

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qobject.cpp
# Opt level: O1

void __thiscall QObjectPrivate::setObjectNameWithoutBindings(QObjectPrivate *this,QString *name)

{
  ExtraData *pEVar1;
  
  if (this->extraData == (ExtraData *)0x0) {
    pEVar1 = (ExtraData *)operator_new(0x80);
    (pEVar1->propertyNames).d.d = (Data *)0x0;
    (pEVar1->propertyNames).d.ptr = (QByteArray *)0x0;
    (pEVar1->propertyNames).d.size = 0;
    (pEVar1->propertyValues).d.d = (Data *)0x0;
    (pEVar1->propertyValues).d.ptr = (QVariant *)0x0;
    (pEVar1->propertyValues).d.size = 0;
    (pEVar1->runningTimers).d.d = (Data *)0x0;
    (pEVar1->runningTimers).d.ptr = (TimerId *)0x0;
    (pEVar1->runningTimers).d.size = 0;
    (pEVar1->eventFilters).d.d = (Data *)0x0;
    (pEVar1->eventFilters).d.ptr = (QPointer<QObject> *)0x0;
    (pEVar1->eventFilters).d.size = 0;
    (pEVar1->objectName).super_QPropertyData<QString>.val.d.d = (Data *)0x0;
    (pEVar1->objectName).super_QPropertyData<QString>.val.d.ptr = (char16_t *)0x0;
    (pEVar1->objectName).super_QPropertyData<QString>.val.d.size = 0;
    pEVar1->parent = this;
    this->extraData = pEVar1;
  }
  QString::operator=((QString *)&this->extraData->objectName,name);
  return;
}

Assistant:

void QObjectPrivate::setObjectNameWithoutBindings(const QString &name)
{
    ensureExtraData();
    extraData->objectName.setValueBypassingBindings(name);
}